

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer pnVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  type_conflict5 tVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  cpp_dec_float<100U,_int,_void> *pcVar15;
  int iVar16;
  int *piVar17;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  int *local_1c8;
  cpp_dec_float<100U,_int,_void> local_188;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_138;
  long local_130;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 0x10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems[6] = 0;
  local_d8.data._M_elems[7] = 0;
  local_d8.data._M_elems[8] = 0;
  local_d8.data._M_elems[9] = 0;
  local_d8.data._M_elems[10] = 0;
  local_d8.data._M_elems[0xb] = 0;
  local_d8.data._M_elems[0xc] = 0;
  local_d8.data._M_elems[0xd] = 0;
  local_d8.data._M_elems._56_5_ = 0;
  local_d8.data._M_elems[0xf]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  pnVar5 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar6 = (this->l).idx;
  piVar7 = (this->l).row;
  uVar2 = (this->l).firstUpdate;
  uVar14 = 0;
  uVar13 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar13 = uVar14;
  }
  piVar8 = (this->l).start;
  local_138 = this;
  for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
    iVar12 = piVar7[uVar14];
    local_d8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar12].m_backend.data._M_elems;
    local_d8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar12].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar12].m_backend.data._M_elems + 4;
    local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar12].m_backend.data._M_elems + 8;
    local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar12].m_backend.data._M_elems + 0xc;
    local_d8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar9 = *(undefined8 *)(puVar1 + 2);
    local_d8.data._M_elems._56_5_ = SUB85(uVar9,0);
    local_d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
    local_d8.exp = vec[iVar12].m_backend.exp;
    local_d8.neg = vec[iVar12].m_backend.neg;
    local_d8.fpclass = vec[iVar12].m_backend.fpclass;
    local_d8.prec_elem = vec[iVar12].m_backend.prec_elem;
    local_188.data._M_elems[0] = 0;
    local_188.data._M_elems[1] = 0;
    tVar11 = boost::multiprecision::operator!=
                       ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_d8,(double *)&local_188);
    if (tVar11) {
      local_130 = (long)piVar8[uVar14];
      local_1c8 = piVar6 + local_130;
      pcVar15 = &pnVar5[local_130].m_backend;
      for (iVar12 = piVar8[uVar14 + 1]; (int)local_130 < iVar12; iVar12 = iVar12 + -1) {
        local_188.fpclass = cpp_dec_float_finite;
        local_188.prec_elem = 0x10;
        local_188.data._M_elems[0] = 0;
        local_188.data._M_elems[1] = 0;
        local_188.data._M_elems[2] = 0;
        local_188.data._M_elems[3] = 0;
        local_188.data._M_elems[4] = 0;
        local_188.data._M_elems[5] = 0;
        local_188.data._M_elems[6] = 0;
        local_188.data._M_elems[7] = 0;
        local_188.data._M_elems[8] = 0;
        local_188.data._M_elems[9] = 0;
        local_188.data._M_elems[10] = 0;
        local_188.data._M_elems[0xb] = 0;
        local_188.data._M_elems[0xc] = 0;
        local_188.data._M_elems[0xd] = 0;
        local_188.data._M_elems._56_5_ = 0;
        local_188.data._M_elems[0xf]._1_3_ = 0;
        local_188.exp = 0;
        local_188.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_188,&local_d8,pcVar15);
        iVar3 = *local_1c8;
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_88,&local_d8,pcVar15);
        local_128.fpclass = cpp_dec_float_finite;
        local_128.prec_elem = 0x10;
        local_128.data._M_elems[0] = 0;
        local_128.data._M_elems[1] = 0;
        local_128.data._M_elems[2] = 0;
        local_128.data._M_elems[3] = 0;
        local_128.data._M_elems[4] = 0;
        local_128.data._M_elems[5] = 0;
        local_128.data._M_elems[6] = 0;
        local_128.data._M_elems[7] = 0;
        local_128.data._M_elems[8] = 0;
        local_128.data._M_elems[9] = 0;
        local_128.data._M_elems[10] = 0;
        local_128.data._M_elems[0xb] = 0;
        local_128.data._M_elems[0xc] = 0;
        local_128.data._M_elems[0xd] = 0;
        local_128.data._M_elems._56_5_ = 0;
        local_128.data._M_elems[0xf]._1_3_ = 0;
        local_128.exp = 0;
        local_128.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_128,&vec[iVar3].m_backend,&local_88);
        local_188.fpclass = cpp_dec_float_finite;
        local_188.prec_elem = 0x10;
        local_188.data._M_elems[0] = 0;
        local_188.data._M_elems[1] = 0;
        local_188.data._M_elems[2] = 0;
        local_188.data._M_elems[3] = 0;
        local_188.data._M_elems[4] = 0;
        local_188.data._M_elems[5] = 0;
        local_188.data._M_elems[6] = 0;
        local_188.data._M_elems[7] = 0;
        local_188.data._M_elems[8] = 0;
        local_188.data._M_elems[9] = 0;
        local_188.data._M_elems[10] = 0;
        local_188.data._M_elems[0xb] = 0;
        local_188.data._M_elems[0xc] = 0;
        local_188.data._M_elems[0xd] = 0;
        local_188.data._M_elems._56_5_ = 0;
        local_188.data._M_elems[0xf]._1_3_ = 0;
        local_188.exp = 0;
        local_188.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_188,&local_d8,pcVar15);
        iVar3 = *local_1c8;
        local_1c8 = local_1c8 + 1;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&vec[iVar3].m_backend,&local_188);
        pcVar15 = pcVar15 + 1;
      }
    }
  }
  if ((local_138->l).updateType != 0) {
    iVar12 = (local_138->l).firstUnused;
    while ((long)uVar13 < (long)iVar12) {
      iVar3 = piVar8[uVar13];
      piVar17 = piVar6 + iVar3;
      iVar16 = piVar7[uVar13];
      local_188.data._M_elems[0] = vec[iVar16].m_backend.data._M_elems[0];
      puVar1 = vec[iVar16].m_backend.data._M_elems + 0xc;
      uVar9 = *(undefined8 *)(puVar1 + 2);
      local_188.data._M_elems[0xd] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
      local_188.data._M_elems._56_5_ = SUB85(uVar9,0);
      local_188.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
      puVar1 = vec[iVar16].m_backend.data._M_elems + 9;
      uVar9 = *(undefined8 *)puVar1;
      uVar10 = *(undefined8 *)(puVar1 + 2);
      local_188.data._M_elems[9] = (uint)uVar9;
      local_188.data._M_elems[10] = (uint)((ulong)uVar9 >> 0x20);
      local_188.data._M_elems[0xb] = (uint)uVar10;
      local_188.data._M_elems[0xc] = (uint)((ulong)uVar10 >> 0x20);
      puVar1 = vec[iVar16].m_backend.data._M_elems + 5;
      uVar9 = *(undefined8 *)puVar1;
      uVar10 = *(undefined8 *)(puVar1 + 2);
      local_188.data._M_elems[5] = (uint)uVar9;
      local_188.data._M_elems[6] = (uint)((ulong)uVar9 >> 0x20);
      local_188.data._M_elems[7] = (uint)uVar10;
      local_188.data._M_elems[8] = (uint)((ulong)uVar10 >> 0x20);
      puVar1 = vec[iVar16].m_backend.data._M_elems + 1;
      uVar9 = *(undefined8 *)puVar1;
      uVar10 = *(undefined8 *)(puVar1 + 2);
      local_188.data._M_elems[1] = (uint)uVar9;
      local_188.data._M_elems[2] = (uint)((ulong)uVar9 >> 0x20);
      local_188.data._M_elems[3] = (uint)uVar10;
      local_188.data._M_elems[4] = (uint)((ulong)uVar10 >> 0x20);
      local_188.exp = vec[iVar16].m_backend.exp;
      local_188.fpclass = vec[iVar16].m_backend.fpclass;
      local_188.prec_elem = vec[iVar16].m_backend.prec_elem;
      local_188.neg =
           (bool)((local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite) ^
                 vec[iVar16].m_backend.neg);
      pcVar15 = &pnVar5[iVar3].m_backend;
      for (iVar16 = piVar8[uVar13 + 1]; iVar3 < iVar16; iVar16 = iVar16 + -1) {
        iVar4 = *piVar17;
        piVar17 = piVar17 + 1;
        local_128.fpclass = cpp_dec_float_finite;
        local_128.prec_elem = 0x10;
        local_128.data._M_elems[0] = 0;
        local_128.data._M_elems[1] = 0;
        local_128.data._M_elems[2] = 0;
        local_128.data._M_elems[3] = 0;
        local_128.data._M_elems[4] = 0;
        local_128.data._M_elems[5] = 0;
        local_128.data._M_elems[6] = 0;
        local_128.data._M_elems[7] = 0;
        local_128.data._M_elems[8] = 0;
        local_128.data._M_elems[9] = 0;
        local_128.data._M_elems[10] = 0;
        local_128.data._M_elems[0xb] = 0;
        local_128.data._M_elems[0xc] = 0;
        local_128.data._M_elems[0xd] = 0;
        local_128.data._M_elems._56_5_ = 0;
        local_128.data._M_elems[0xf]._1_3_ = 0;
        local_128.exp = 0;
        local_128.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_128,&vec[iVar4].m_backend,pcVar15);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&local_188,&local_128);
        pcVar15 = pcVar15 + 1;
      }
      iVar3 = piVar7[uVar13];
      vec[iVar3].m_backend.data._M_elems[0] = local_188.data._M_elems[0];
      puVar1 = vec[iVar3].m_backend.data._M_elems + 1;
      *(ulong *)puVar1 = CONCAT44(local_188.data._M_elems[2],local_188.data._M_elems[1]);
      *(ulong *)(puVar1 + 2) = CONCAT44(local_188.data._M_elems[4],local_188.data._M_elems[3]);
      puVar1 = vec[iVar3].m_backend.data._M_elems + 5;
      *(ulong *)puVar1 = CONCAT44(local_188.data._M_elems[6],local_188.data._M_elems[5]);
      *(ulong *)(puVar1 + 2) = CONCAT44(local_188.data._M_elems[8],local_188.data._M_elems[7]);
      puVar1 = vec[iVar3].m_backend.data._M_elems + 9;
      *(ulong *)puVar1 = CONCAT44(local_188.data._M_elems[10],local_188.data._M_elems[9]);
      *(ulong *)(puVar1 + 2) = CONCAT44(local_188.data._M_elems[0xc],local_188.data._M_elems[0xb]);
      puVar1 = vec[iVar3].m_backend.data._M_elems + 0xc;
      *(ulong *)puVar1 = CONCAT44(local_188.data._M_elems[0xd],local_188.data._M_elems[0xc]);
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_188.data._M_elems[0xf]._1_3_,local_188.data._M_elems._56_5_);
      vec[iVar3].m_backend.exp = local_188.exp;
      vec[iVar3].m_backend.neg =
           (bool)((local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite) ^
                 local_188.neg);
      vec[iVar3].m_backend.fpclass = local_188.fpclass;
      vec[iVar3].m_backend.prec_elem = local_188.prec_elem;
      uVar13 = uVar13 + 1;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLright(R* vec)
{
   int i, j, k;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = 0; i < end; ++i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);

         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            SPxOut::debug(this, "                         -> y{} -= {} * {} = {}    -> {}\n", *idx, x, *val,
                          x * (*val), vec[*idx] - x * (*val));
            vec[*idx++] -= x * (*val++);
         }
      }
   }

   if(l.updateType)                      /* Forest-Tomlin Updates */
   {
      SPxOut::debug(this, "performing FT updates...\n");

      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);
         StableSum<R> tmp(-vec[lrow[i]]);

         for(j = lbeg[i + 1]; j > k; --j)
            tmp += vec[*idx++] * (*val++);

         vec[lrow[i]] = -R(tmp);

         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);
      }

      SPxOut::debug(this, "finished FT updates.\n");
   }
}